

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

content_type __thiscall cinatra::coro_http_request::get_content_type(coro_http_request *this)

{
  bool bVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  string_view sVar3;
  coro_http_request *in_stack_00000010;
  string_view content_type;
  char *in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  content_type local_4;
  
  this_00 = in_RDI;
  bVar1 = is_chunked((coro_http_request *)0x3a1e87);
  if (bVar1) {
    local_4 = chunked;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    sVar3 = get_header_value(in_stack_00000010,content_type);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0)
    ;
    if (bVar1) {
      if (((ulong)in_RDI[7]._M_str & 1) == 0) {
        local_4 = unknown;
      }
      else {
        local_4 = websocket;
      }
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        (this_00,sVar3._M_str,sVar3._M_len);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (this_00,sVar3._M_str,sVar3._M_len);
        if (sVar2 == 0xffffffffffffffff) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            (this_00,sVar3._M_str,sVar3._M_len);
          if (sVar2 == 0xffffffffffffffff) {
            local_4 = string;
          }
          else {
            local_4 = octet_stream;
          }
        }
        else {
          local_4 = multipart;
        }
      }
      else {
        local_4 = urlencoded;
      }
    }
  }
  return local_4;
}

Assistant:

content_type get_content_type() {
    if (is_chunked())
      return content_type::chunked;

    auto content_type = get_header_value("content-type");
    if (!content_type.empty()) {
      if (content_type.find("application/x-www-form-urlencoded") !=
          std::string_view::npos) {
        return content_type::urlencoded;
      }
      else if (content_type.find("multipart/form-data") !=
               std::string_view::npos) {
        return content_type::multipart;
      }
      else if (content_type.find("application/octet-stream") !=
               std::string_view::npos) {
        return content_type::octet_stream;
      }
      else {
        return content_type::string;
      }
    }

    if (is_websocket_) {
      return content_type::websocket;
    }

    return content_type::unknown;
  }